

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preprocessor.cpp
# Opt level: O3

bool __thiscall r_comp::Preprocessor::isTemplateClass(Preprocessor *this,Ptr *replistruct)

{
  Type TVar1;
  element_type *peVar2;
  pointer psVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  bool bVar4;
  int iVar5;
  pointer psVar6;
  string name;
  string type;
  Ptr local_88;
  undefined1 *local_78;
  undefined8 local_70;
  undefined1 local_68 [16];
  Preprocessor *local_58;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40 [16];
  
  peVar2 = (replistruct->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
  ;
  psVar6 = (peVar2->args).
           super__Vector_base<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar3 = (peVar2->args).
           super__Vector_base<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (psVar6 != psVar3) {
    local_58 = this;
    do {
      peVar2 = (psVar6->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      this_00 = (psVar6->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>).
                _M_refcount._M_pi;
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this_00->_M_use_count = this_00->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this_00->_M_use_count = this_00->_M_use_count + 1;
        }
      }
      local_78 = local_68;
      local_70 = 0;
      local_68[0] = 0;
      local_48 = 0;
      local_40[0] = 0;
      TVar1 = peVar2->type;
      local_50 = local_40;
      if ((TVar1 - Structure < 2) || (TVar1 == Development)) {
        if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            this_00->_M_use_count = this_00->_M_use_count + 1;
            UNLOCK();
          }
          else {
            this_00->_M_use_count = this_00->_M_use_count + 1;
          }
        }
        local_88.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar2
        ;
        local_88.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = this_00;
        bVar4 = isTemplateClass(local_58,&local_88);
        if (local_88.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_88.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if (bVar4) goto LAB_00138652;
      }
      else if ((TVar1 == Atom) &&
              (iVar5 = std::__cxx11::string::compare((char *)&peVar2->cmd), iVar5 == 0)) {
LAB_00138652:
        if (local_50 != local_40) {
          operator_delete(local_50);
        }
        if (local_78 != local_68) {
          operator_delete(local_78);
        }
        if (this_00 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          return true;
        }
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
        return true;
      }
      if (local_50 != local_40) {
        operator_delete(local_50);
      }
      if (local_78 != local_68) {
        operator_delete(local_78);
      }
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      }
      psVar6 = psVar6 + 1;
    } while (psVar6 != psVar3);
  }
  return false;
}

Assistant:

bool Preprocessor::isTemplateClass(RepliStruct::Ptr replistruct)
{
    for (RepliStruct::Ptr childstruct : replistruct->args) {
        std::string name;
        std::string type;

        switch (childstruct->type) {
        case RepliStruct::Atom:
            if (childstruct->cmd == ":~") {
                return true;
            }

            break;

        case RepliStruct::Structure: // template instantiation; args are the actual parameters.
        case RepliStruct::Development: // actual template arg as a list of args.
        case RepliStruct::Set: // sets can contain tpl args.
            if (isTemplateClass(childstruct)) {
                return true;
            }

            break;

        default:
            break;
        }
    }

    return false;
}